

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

LinkInterface * __thiscall cmTarget::GetLinkInterface(cmTarget *this,string *config,cmTarget *head)

{
  bool bVar1;
  TargetType TVar2;
  cmTargetInternals *pcVar3;
  pointer ppVar4;
  cmTarget *local_c0;
  byte local_99;
  OptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
  local_70;
  _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
  local_68 [3];
  map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
  *local_50;
  HeadToLinkInterfaceMap *hm;
  string CONFIG;
  cmTarget *head_local;
  string *config_local;
  cmTarget *this_local;
  
  CONFIG.field_2._8_8_ = head;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmTarget *)
                 GetImportLinkInterface(this,config,(cmTarget *)CONFIG.field_2._8_8_,false);
  }
  else {
    TVar2 = GetType(this);
    if ((TVar2 != EXECUTABLE) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
      cmsys::SystemTools::UpperCase((string *)&hm,config);
      pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
      local_50 = &std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
                  ::operator[](&pcVar3->LinkInterfaceMap,(key_type *)&hm)->
                  super_map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
      ;
      bVar1 = std::
              map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
              ::empty(local_50);
      local_99 = 0;
      if (!bVar1) {
        local_68[0]._M_node =
             (_Base_ptr)
             std::
             map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
             ::begin(local_50);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
                 ::operator->(local_68);
        local_99 = (ppVar4->second).super_LinkInterface.field_0x6c ^ 0xff;
      }
      if ((local_99 & 1) == 0) {
        local_c0 = (cmTarget *)
                   std::
                   map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
                   ::operator[](local_50,(key_type *)((long)&CONFIG.field_2 + 8));
        if (((local_c0->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_color & 0x100) == _S_red) {
          *(byte *)((long)&(local_c0->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_color + 1) = 1;
          pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
          cmTargetInternals::ComputeLinkInterfaceLibraries
                    (pcVar3,this,config,(OptionalLinkInterface *)local_c0,
                     (cmTarget *)CONFIG.field_2._8_8_,false);
        }
        if ((((local_c0->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_color & 0x10000) == _S_red) &&
           (*(byte *)((long)&(local_c0->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_color + 2) = 1,
           ((local_c0->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_color & 0x1000000) != _S_red)) {
          pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
          cmTargetInternals::ComputeLinkInterface
                    (pcVar3,this,config,(OptionalLinkInterface *)local_c0,
                     (cmTarget *)CONFIG.field_2._8_8_);
        }
        if (((local_c0->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_color & 0x1000000) == _S_red) {
          local_c0 = (cmTarget *)0x0;
        }
        this_local = local_c0;
      }
      else {
        local_70._M_node =
             (_Base_ptr)
             std::
             map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
             ::begin(local_50);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
                 ::operator->(&local_70);
        this_local = (cmTarget *)&ppVar4->second;
      }
      std::__cxx11::string::~string((string *)&hm);
    }
    else {
      this_local = (cmTarget *)0x0;
    }
  }
  return (LinkInterface *)this_local;
}

Assistant:

cmTarget::LinkInterface const* cmTarget::GetLinkInterface(
                                                  const std::string& config,
                                                  cmTarget const* head) const
{
  // Imported targets have their own link interface.
  if(this->IsImported())
    {
    return this->GetImportLinkInterface(config, head, false);
    }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if(this->GetType() == cmTarget::EXECUTABLE &&
     !this->IsExecutableWithExports())
    {
    return 0;
    }

  // Lookup any existing link interface for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmTargetInternals::HeadToLinkInterfaceMap& hm =
    this->Internal->LinkInterfaceMap[CONFIG];

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if(!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition)
    {
    return &hm.begin()->second;
    }

  cmTargetInternals::OptionalLinkInterface& iface = hm[head];
  if(!iface.LibrariesDone)
    {
    iface.LibrariesDone = true;
    this->Internal->ComputeLinkInterfaceLibraries(
      this, config, iface, head, false);
    }
  if(!iface.AllDone)
    {
    iface.AllDone = true;
    if(iface.Exists)
      {
      this->Internal->ComputeLinkInterface(this, config, iface, head);
      }
    }

  return iface.Exists? &iface : 0;
}